

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O2

spv_result_t spvtools::anon_unknown_6::getWord(spv_text text,spv_position position,string *word)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  spv_result_t sVar5;
  ulong uVar6;
  byte bVar7;
  bool bVar8;
  byte bVar9;
  
  pcVar1 = text->str;
  sVar5 = SPV_ERROR_INVALID_TEXT;
  if ((pcVar1 != (char *)0x0) && (uVar2 = text->length, uVar2 != 0)) {
    if (position == (spv_position)0x0) {
      sVar5 = SPV_ERROR_INVALID_POINTER;
    }
    else {
      uVar3 = position->index;
      bVar7 = 0;
      bVar9 = 0;
      uVar4 = uVar3;
      while (uVar4 < uVar2) {
        uVar6 = (ulong)(byte)pcVar1[uVar4];
        if (uVar6 < 0x3c) {
          if ((0x800000100002600U >> (uVar6 & 0x3f) & 1) == 0) {
            if (uVar6 == 0x22) {
              bVar7 = bVar7 ^ bVar9 ^ 1;
              goto LAB_001773cd;
            }
            if (uVar6 != 0) goto LAB_001773c2;
            break;
          }
          bVar8 = (bool)(bVar9 | bVar7);
          bVar9 = 0;
          if (!bVar8) {
            std::__cxx11::string::assign<char_const*,void>
                      ((string *)word,pcVar1 + uVar3,pcVar1 + uVar4);
            return SPV_SUCCESS;
          }
        }
        else {
LAB_001773c2:
          if (pcVar1[uVar4] == 0x5c) {
            bVar9 = bVar9 ^ 1;
          }
          else {
LAB_001773cd:
            bVar9 = 0;
          }
        }
        position->column = position->column + 1;
        uVar4 = uVar4 + 1;
        position->index = uVar4;
      }
      std::__cxx11::string::assign<char_const*,void>((string *)word,pcVar1 + uVar3,pcVar1 + uVar4);
      sVar5 = SPV_SUCCESS;
    }
  }
  return sVar5;
}

Assistant:

spv_result_t getWord(spv_text text, spv_position position, std::string* word) {
  if (!text->str || !text->length) return SPV_ERROR_INVALID_TEXT;
  if (!position) return SPV_ERROR_INVALID_POINTER;

  const size_t start_index = position->index;

  bool quoting = false;
  bool escaping = false;

  // NOTE: Assumes first character is not white space!
  while (true) {
    if (position->index >= text->length) {
      word->assign(text->str + start_index, text->str + position->index);
      return SPV_SUCCESS;
    }
    const char ch = text->str[position->index];
    if (ch == '\\') {
      escaping = !escaping;
    } else {
      switch (ch) {
        case '"':
          if (!escaping) quoting = !quoting;
          break;
        case ' ':
        case ';':
        case '\t':
        case '\n':
        case '\r':
          if (escaping || quoting) break;
          word->assign(text->str + start_index, text->str + position->index);
          return SPV_SUCCESS;
        case '\0': {  // NOTE: End of word found!
          word->assign(text->str + start_index, text->str + position->index);
          return SPV_SUCCESS;
        }
        default:
          break;
      }
      escaping = false;
    }

    position->column++;
    position->index++;
  }
}